

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cc
# Opt level: O0

ObjectArray __thiscall xt::new_object_array(xt *this,uint size)

{
  vector<xt::Object,_std::allocator<xt::Object>_> *this_00;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ObjectArray OVar2;
  uint size_local;
  ObjectArray *o;
  
  this_00 = (vector<xt::Object,_std::allocator<xt::Object>_> *)operator_new(0x18);
  std::vector<xt::Object,_std::allocator<xt::Object>_>::vector(this_00);
  std::shared_ptr<std::vector<xt::Object,std::allocator<xt::Object>>>::
  shared_ptr<std::vector<xt::Object,std::allocator<xt::Object>>,void>
            ((shared_ptr<std::vector<xt::Object,std::allocator<xt::Object>>> *)this,this_00);
  _Var1._M_pi = extraout_RDX;
  if (size != 0) {
    this_01 = std::
              __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    std::vector<xt::Object,_std::allocator<xt::Object>_>::reserve(this_01,(ulong)size);
    _Var1._M_pi = extraout_RDX_00;
  }
  OVar2.
  super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  OVar2.
  super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ObjectArray)
         OVar2.
         super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ObjectArray new_object_array(unsigned int size) {
	auto o = ObjectArray(new std::vector<Object>);
	if (size != 0) o->reserve(size);
	return o;
}